

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

void adt_hash_set(adt_hash_t *self,char *pKey,void *pVal)

{
  adt_hnode_t *node;
  uint32_t u32Hash;
  adt_hkey_t *paVar1;
  char *pcVar2;
  
  if (pKey != (char *)0x0 && self != (adt_hash_t *)0x0) {
    u32Hash = adt_hash_string(pKey);
    node = self->root;
    paVar1 = adt_hnode_find(node,pKey,u32Hash);
    if (paVar1 == (adt_hkey_t *)0x0) {
      paVar1 = (adt_hkey_t *)malloc(0x18);
      if (paVar1 != (adt_hkey_t *)0x0) {
        pcVar2 = strdup(pKey);
        paVar1->key = pcVar2;
        paVar1->val = pVal;
        paVar1->next = (adt_hkey_tag *)0x0;
        adt_hnode_insert(node,paVar1,u32Hash);
        self->u32Size = self->u32Size + 1;
      }
    }
    else {
      if ((self->pDestructor != (_func_void_void_ptr *)0x0) && (paVar1->val != (void *)0x0)) {
        (*self->pDestructor)(paVar1->val);
      }
      paVar1->val = pVal;
    }
  }
  return;
}

Assistant:

void adt_hash_set(adt_hash_t *self, const char *pKey, void *pVal){
	if(self && pKey){
		uint32_t u32HashVal = adt_hash_string(pKey);
		adt_hkey_t *hkey = adt_hnode_find(self->root,pKey,u32HashVal);
		if(hkey){
			//already in hash table
			if(self->pDestructor && hkey->val){
				self->pDestructor(hkey->val);
			}
			hkey->val = pVal;
		}
		else{
			//not found
			hkey = adt_hkey_new(pKey,pVal);
			if(hkey){
				adt_hnode_insert(self->root,hkey,u32HashVal);
				self->u32Size++;
			}
		}
	}
}